

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvAllocVectors(CVodeMem cv_mem,N_Vector tmpl)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_4;
  
  uVar1 = N_VClone(in_RSI);
  *(undefined8 *)(in_RDI + 0x1b8) = uVar1;
  if (*(long *)(in_RDI + 0x1b8) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = N_VClone(in_RSI);
    *(undefined8 *)(in_RDI + 0x1c8) = uVar1;
    if (*(long *)(in_RDI + 0x1c8) == 0) {
      N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
      local_4 = 0;
    }
    else {
      uVar1 = N_VClone(in_RSI);
      *(undefined8 *)(in_RDI + 0x1d0) = uVar1;
      if (*(long *)(in_RDI + 0x1d0) == 0) {
        N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
        N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
        local_4 = 0;
      }
      else {
        uVar1 = N_VClone(in_RSI);
        *(undefined8 *)(in_RDI + 0x1d8) = uVar1;
        if (*(long *)(in_RDI + 0x1d8) == 0) {
          N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
          local_4 = 0;
        }
        else {
          uVar1 = N_VClone(in_RSI);
          *(undefined8 *)(in_RDI + 0x1e0) = uVar1;
          if (*(long *)(in_RDI + 0x1e0) == 0) {
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
            local_4 = 0;
          }
          else {
            uVar1 = N_VClone(in_RSI);
            *(undefined8 *)(in_RDI + 0x1e8) = uVar1;
            if (*(long *)(in_RDI + 0x1e8) == 0) {
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
              local_4 = 0;
            }
            else {
              uVar1 = N_VClone(in_RSI);
              *(undefined8 *)(in_RDI + 0x1f0) = uVar1;
              if (*(long *)(in_RDI + 0x1f0) == 0) {
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1e8));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                local_4 = 0;
              }
              else {
                for (local_20 = 0; local_20 <= *(int *)(in_RDI + 0x598); local_20 = local_20 + 1) {
                  uVar1 = N_VClone(in_RSI);
                  *(undefined8 *)(in_RDI + 0x150 + (long)local_20 * 8) = uVar1;
                  if (*(long *)(in_RDI + 0x150 + (long)local_20 * 8) == 0) {
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1e8));
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x1f0));
                    for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
                      N_VDestroy(*(undefined8 *)(in_RDI + 0x150 + (long)local_1c * 8));
                    }
                    return 0;
                  }
                }
                *(long *)(in_RDI + 0x718) =
                     (long)(*(int *)(in_RDI + 0x598) + 8) * *(long *)(in_RDI + 0x6f8) +
                     *(long *)(in_RDI + 0x718);
                *(long *)(in_RDI + 0x720) =
                     (long)(*(int *)(in_RDI + 0x598) + 8) * *(long *)(in_RDI + 0x700) +
                     *(long *)(in_RDI + 0x720);
                *(undefined4 *)(in_RDI + 0x830) = *(undefined4 *)(in_RDI + 0x598);
                local_4 = 1;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype cvAllocVectors(CVodeMem cv_mem, N_Vector tmpl)
{
  int i, j;

  /* Allocate ewt, acor, tempv, ftemp */

  cv_mem->cv_ewt = N_VClone(tmpl);
  if (cv_mem->cv_ewt == NULL) { return (SUNFALSE); }

  cv_mem->cv_acor = N_VClone(tmpl);
  if (cv_mem->cv_acor == NULL)
  {
    N_VDestroy(cv_mem->cv_ewt);
    return (SUNFALSE);
  }

  cv_mem->cv_tempv = N_VClone(tmpl);
  if (cv_mem->cv_tempv == NULL)
  {
    N_VDestroy(cv_mem->cv_ewt);
    N_VDestroy(cv_mem->cv_acor);
    return (SUNFALSE);
  }

  cv_mem->cv_ftemp = N_VClone(tmpl);
  if (cv_mem->cv_ftemp == NULL)
  {
    N_VDestroy(cv_mem->cv_tempv);
    N_VDestroy(cv_mem->cv_ewt);
    N_VDestroy(cv_mem->cv_acor);
    return (SUNFALSE);
  }

  cv_mem->cv_vtemp1 = N_VClone(tmpl);
  if (cv_mem->cv_vtemp1 == NULL)
  {
    N_VDestroy(cv_mem->cv_ftemp);
    N_VDestroy(cv_mem->cv_tempv);
    N_VDestroy(cv_mem->cv_ewt);
    N_VDestroy(cv_mem->cv_acor);
    return (SUNFALSE);
  }

  cv_mem->cv_vtemp2 = N_VClone(tmpl);
  if (cv_mem->cv_vtemp2 == NULL)
  {
    N_VDestroy(cv_mem->cv_vtemp1);
    N_VDestroy(cv_mem->cv_ftemp);
    N_VDestroy(cv_mem->cv_tempv);
    N_VDestroy(cv_mem->cv_ewt);
    N_VDestroy(cv_mem->cv_acor);
    return (SUNFALSE);
  }

  cv_mem->cv_vtemp3 = N_VClone(tmpl);
  if (cv_mem->cv_vtemp3 == NULL)
  {
    N_VDestroy(cv_mem->cv_vtemp2);
    N_VDestroy(cv_mem->cv_vtemp1);
    N_VDestroy(cv_mem->cv_ftemp);
    N_VDestroy(cv_mem->cv_tempv);
    N_VDestroy(cv_mem->cv_ewt);
    N_VDestroy(cv_mem->cv_acor);
    return (SUNFALSE);
  }

  /* Allocate zn[0] ... zn[qmax] */

  for (j = 0; j <= cv_mem->cv_qmax; j++)
  {
    cv_mem->cv_zn[j] = N_VClone(tmpl);
    if (cv_mem->cv_zn[j] == NULL)
    {
      N_VDestroy(cv_mem->cv_ewt);
      N_VDestroy(cv_mem->cv_acor);
      N_VDestroy(cv_mem->cv_tempv);
      N_VDestroy(cv_mem->cv_ftemp);
      N_VDestroy(cv_mem->cv_vtemp1);
      N_VDestroy(cv_mem->cv_vtemp2);
      N_VDestroy(cv_mem->cv_vtemp3);
      for (i = 0; i < j; i++) { N_VDestroy(cv_mem->cv_zn[i]); }
      return (SUNFALSE);
    }
  }

  /* Update solver workspace lengths  */
  cv_mem->cv_lrw += (cv_mem->cv_qmax + 8) * cv_mem->cv_lrw1;
  cv_mem->cv_liw += (cv_mem->cv_qmax + 8) * cv_mem->cv_liw1;

  /* Store the value of qmax used here */
  cv_mem->cv_qmax_alloc = cv_mem->cv_qmax;

  return (SUNTRUE);
}